

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O0

bool __thiscall
Lib::Set<Kernel::TermList,_Lib::DefaultHash>::contains
          (Set<Kernel::TermList,_Lib::DefaultHash> *this,TermList val)

{
  bool bVar1;
  Set<Kernel::TermList,_Lib::DefaultHash> *in_RDI;
  Cell *cell;
  uint code;
  TermList *in_stack_ffffffffffffffc8;
  Cell *local_28;
  uint local_1c;
  
  local_1c = DefaultHash::hash<Kernel::TermList>((TermList *)0x9913f2);
  if (local_1c < 2) {
    local_1c = 2;
  }
  local_28 = firstCellForCode(in_RDI,local_1c);
  while( true ) {
    bVar1 = Cell::empty(local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    bVar1 = Cell::deleted(local_28);
    if (((!bVar1) && (local_28->code == local_1c)) &&
       (bVar1 = DefaultHash::equals<Kernel::TermList>((TermList *)in_RDI,in_stack_ffffffffffffffc8),
       bVar1)) break;
    local_28 = nextCell(in_RDI,local_28);
  }
  return true;
}

Assistant:

bool contains (Val val) const
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	return true;
      }
    }
    return false;
  }